

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3x4.c
# Opt level: O0

void glmc_mat3x4_copy(vec4 *src,vec4 *dest)

{
  vec4 *dest_local;
  vec4 *src_local;
  
  (*dest)[0] = (*src)[0];
  (*dest)[1] = (*src)[1];
  (*dest)[2] = (*src)[2];
  (*dest)[3] = (*src)[3];
  dest[1][0] = src[1][0];
  dest[1][1] = src[1][1];
  dest[1][2] = src[1][2];
  dest[1][3] = src[1][3];
  dest[2][0] = src[2][0];
  dest[2][1] = src[2][1];
  dest[2][2] = src[2][2];
  dest[2][3] = src[2][3];
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3x4_copy(mat3x4 src, mat3x4 dest) {
  glm_mat3x4_copy(src, dest);
}